

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineSamplerTests.cpp
# Opt level: O2

TestCaseGroup * vkt::pipeline::createSamplerTests(TestContext *testCtx)

{
  VkImageViewType imageViewType;
  VkFormat format;
  VkSamplerAddressMode value;
  VkSamplerAddressMode value_00;
  VkSamplerAddressMode value_01;
  BorderColor color;
  _Alloc_hider _Var1;
  bool bVar2;
  VkBorderColor VVar3;
  TestCaseGroup *pTVar4;
  char *pcVar5;
  TestNode *pTVar6;
  TestNode *pTVar7;
  SamplerTest *this;
  ostream *poVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> mipmapLinearTests;
  string fullNameV;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> formatGroup;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> addressModesTests;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> mipmapTests;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> magFilterTests;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> formatTests;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> viewTypeGroup;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> viewTypeTests;
  string fullNameW;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> samplerTests;
  char *local_288 [4];
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string fullName;
  string local_50;
  
  pTVar4 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar4,testCtx,"sampler","Sampler tests");
  samplerTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
  ptr = pTVar4;
  pTVar4 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar4,testCtx,"view_type","");
  lVar10 = 0;
  viewTypeTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
  .ptr = pTVar4;
  do {
    pTVar4 = viewTypeTests.
             super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
             ptr;
    if (lVar10 == 7) {
      viewTypeTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
      m_data.ptr = (TestCaseGroup *)0x0;
      tcu::TestNode::addChild
                (&(samplerTests.
                   super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                   m_data.ptr)->super_TestNode,&pTVar4->super_TestNode);
      pTVar4 = samplerTests.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
               ptr;
      samplerTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
      m_data.ptr = (TestCaseGroup *)0x0;
      de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
      ~UniqueBase(&viewTypeTests.
                   super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
      de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
      ~UniqueBase(&samplerTests.
                   super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
      return pTVar4;
    }
    imageViewType = (&DAT_00bcf6d0)[lVar10 * 4];
    pTVar4 = (TestCaseGroup *)operator_new(0x70);
    pcVar5 = (char *)(&DAT_00bcf6d8)[lVar10 * 2];
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fullNameV,"Uses a ",(allocator<char> *)&fullNameW);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &mipmapLinearTests,&fullNameV,pcVar5);
    std::operator+(&fullName,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &mipmapLinearTests," view");
    tcu::TestCaseGroup::TestCaseGroup(pTVar4,testCtx,pcVar5,fullName._M_dataplus._M_p);
    viewTypeGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
    m_data.ptr = pTVar4;
    std::__cxx11::string::~string((string *)&fullName);
    std::__cxx11::string::~string((string *)&mipmapLinearTests);
    std::__cxx11::string::~string((string *)&fullNameV);
    pTVar4 = (TestCaseGroup *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup(pTVar4,testCtx,"format","Tests samplable formats");
    formatTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
    .ptr = pTVar4;
    for (lVar9 = 0; lVar9 != 0x40; lVar9 = lVar9 + 1) {
      format = *(VkFormat *)(&DAT_0095e1a0 + lVar9 * 4);
      bVar2 = ::vk::isCompressedFormat(format);
      if (bVar2 && (imageViewType & ~VK_IMAGE_VIEW_TYPE_1D_ARRAY) == VK_IMAGE_VIEW_TYPE_1D) break;
      pTVar4 = (TestCaseGroup *)operator_new(0x70);
      pcVar5 = ::vk::getFormatName(format);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&fullName,pcVar5,(allocator<char> *)&mipmapLinearTests);
      std::__cxx11::string::substr((ulong)&mipmapLinearTests,(ulong)&fullName);
      de::toLower(&fullNameV,(string *)&mipmapLinearTests);
      std::__cxx11::string::~string((string *)&mipmapLinearTests);
      std::__cxx11::string::~string((string *)&fullName);
      _Var1 = fullNameV._M_dataplus;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&mipmapLinearTests,"Samples a texture of format ",
                 (allocator<char> *)&fullNameW);
      pcVar5 = ::vk::getFormatName(format);
      std::operator+(&fullName,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &mipmapLinearTests,pcVar5);
      tcu::TestCaseGroup::TestCaseGroup(pTVar4,testCtx,_Var1._M_p,fullName._M_dataplus._M_p);
      formatGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
      m_data.ptr = pTVar4;
      std::__cxx11::string::~string((string *)&fullName);
      std::__cxx11::string::~string((string *)&mipmapLinearTests);
      std::__cxx11::string::~string((string *)&fullNameV);
      if (!bVar2) {
        pTVar6 = (TestNode *)operator_new(0x70);
        tcu::TestCaseGroup::TestCaseGroup
                  ((TestCaseGroup *)pTVar6,testCtx,"min_filter","Tests for minification filter");
        fullName._M_dataplus._M_p = (pointer)pTVar6;
        bVar2 = ::vk::isCompressedFormat(format);
        if (bVar2) {
LAB_00510f7d:
          pTVar7 = (TestNode *)operator_new(0x128);
          anon_unknown_0::SamplerMinFilterTest::SamplerMinFilterTest
                    ((SamplerMinFilterTest *)pTVar7,testCtx,"linear",
                     "Minifies image using VK_TEX_FILTER_LINEAR",imageViewType,format,
                     VK_FILTER_LINEAR);
          tcu::TestNode::addChild(pTVar6,pTVar7);
        }
        else {
          bVar2 = ::vk::isIntFormat(format);
          if (!bVar2) {
            bVar2 = ::vk::isUintFormat(format);
            if (!bVar2) goto LAB_00510f7d;
          }
        }
        pTVar7 = (TestNode *)operator_new(0x128);
        anon_unknown_0::SamplerMinFilterTest::SamplerMinFilterTest
                  ((SamplerMinFilterTest *)pTVar7,testCtx,"nearest",
                   "Minifies image using VK_TEX_FILTER_NEAREST",imageViewType,format,
                   VK_FILTER_NEAREST);
        tcu::TestNode::addChild(pTVar6,pTVar7);
        _Var1 = fullName._M_dataplus;
        fullName._M_dataplus._M_p = (pointer)0x0;
        tcu::TestNode::addChild
                  (&(formatGroup.
                     super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                     m_data.ptr)->super_TestNode,(TestNode *)_Var1._M_p);
        de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
        ~UniqueBase((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                    &fullName);
      }
      pTVar6 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar6,testCtx,"mag_filter","Tests for magnification filter");
      magFilterTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
      m_data.ptr = (TestCaseGroup *)pTVar6;
      bVar2 = ::vk::isCompressedFormat(format);
      if (bVar2) {
LAB_0051107b:
        pTVar7 = (TestNode *)operator_new(0x128);
        anon_unknown_0::SamplerMagFilterTest::SamplerMagFilterTest
                  ((SamplerMagFilterTest *)pTVar7,testCtx,"linear",
                   "Magnifies image using VK_TEX_FILTER_LINEAR",imageViewType,format,
                   VK_FILTER_LINEAR);
        tcu::TestNode::addChild(pTVar6,pTVar7);
      }
      else {
        bVar2 = ::vk::isIntFormat(format);
        if (!bVar2) {
          bVar2 = ::vk::isUintFormat(format);
          if (!bVar2) goto LAB_0051107b;
        }
      }
      pTVar7 = (TestNode *)operator_new(0x128);
      anon_unknown_0::SamplerMagFilterTest::SamplerMagFilterTest
                ((SamplerMagFilterTest *)pTVar7,testCtx,"nearest",
                 "Magnifies image using VK_TEX_FILTER_NEAREST",imageViewType,format,
                 VK_FILTER_NEAREST);
      tcu::TestNode::addChild(pTVar6,pTVar7);
      pTVar6 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar6,testCtx,"mipmap","Tests for mipmap modes");
      mipmapTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
      m_data.ptr = (TestCaseGroup *)pTVar6;
      pTVar7 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar7,testCtx,"nearest","Uses VK_TEX_MIPMAP_MODE_NEAREST");
      fullName._M_dataplus._M_p = (pointer)pTVar7;
      anon_unknown_0::createSamplerLodTests
                (&mipmapLinearTests,testCtx,imageViewType,format,VK_SAMPLER_MIPMAP_MODE_NEAREST);
      pTVar4 = mipmapLinearTests.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
               ptr;
      mipmapLinearTests.
      super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
           (TestCaseGroup *)0x0;
      tcu::TestNode::addChild(pTVar7,&pTVar4->super_TestNode);
      de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
      ~UniqueBase(&mipmapLinearTests.
                   super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
      _Var1 = fullName._M_dataplus;
      fullName._M_dataplus._M_p = (pointer)0x0;
      tcu::TestNode::addChild(pTVar6,(TestNode *)_Var1._M_p);
      bVar2 = ::vk::isCompressedFormat(format);
      if (bVar2) {
LAB_005111cb:
        pTVar7 = (TestNode *)operator_new(0x70);
        tcu::TestCaseGroup::TestCaseGroup
                  ((TestCaseGroup *)pTVar7,testCtx,"linear","Uses VK_TEX_MIPMAP_MODE_LINEAR");
        mipmapLinearTests.
        super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
             (TestCaseGroup *)pTVar7;
        anon_unknown_0::createSamplerLodTests
                  ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                   &fullNameV,testCtx,imageViewType,format,VK_SAMPLER_MIPMAP_MODE_LINEAR);
        _Var1 = fullNameV._M_dataplus;
        fullNameV._M_dataplus._M_p = (pointer)0x0;
        tcu::TestNode::addChild(pTVar7,(TestNode *)_Var1._M_p);
        de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
        ~UniqueBase((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                    &fullNameV);
        pTVar4 = mipmapLinearTests.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                 m_data.ptr;
        mipmapLinearTests.
        super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
             (TestCaseGroup *)0x0;
        tcu::TestNode::addChild(pTVar6,&pTVar4->super_TestNode);
        de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
        ~UniqueBase(&mipmapLinearTests.
                     super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
      }
      else {
        bVar2 = ::vk::isIntFormat(format);
        if (!bVar2) {
          bVar2 = ::vk::isUintFormat(format);
          if (!bVar2) goto LAB_005111cb;
        }
      }
      de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
      ~UniqueBase((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                  &fullName);
      pTVar4 = magFilterTests.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
               ptr;
      magFilterTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
      m_data.ptr = (TestCaseGroup *)0x0;
      tcu::TestNode::addChild
                (&(formatGroup.
                   super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                   m_data.ptr)->super_TestNode,&pTVar4->super_TestNode);
      pTVar4 = mipmapTests.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
               ptr;
      mipmapTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
      m_data.ptr = (TestCaseGroup *)0x0;
      tcu::TestNode::addChild
                (&(formatGroup.
                   super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                   m_data.ptr)->super_TestNode,&pTVar4->super_TestNode);
      if ((imageViewType != VK_IMAGE_VIEW_TYPE_CUBE) &&
         (imageViewType != VK_IMAGE_VIEW_TYPE_CUBE_ARRAY)) {
        pTVar6 = (TestNode *)operator_new(0x70);
        tcu::TestCaseGroup::TestCaseGroup
                  ((TestCaseGroup *)pTVar6,testCtx,"address_modes","Tests for address modes");
        addressModesTests.
        super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
             (TestCaseGroup *)pTVar6;
        for (lVar11 = 0xc;
            pTVar4 = addressModesTests.
                     super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                     m_data.ptr, lVar11 != 0x1dc; lVar11 = lVar11 + 0x10) {
          this = (SamplerTest *)operator_new(0x138);
          value = *(VkSamplerAddressMode *)(&UNK_0095e364 + lVar11);
          value_00 = *(VkSamplerAddressMode *)(&UNK_0095e368 + lVar11);
          value_01 = *(VkSamplerAddressMode *)(&UNK_0095e36c + lVar11);
          color = *(BorderColor *)((long)&DAT_0095e370 + lVar11);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&fullName);
          if (value_00 == value_01 && value == value_00) {
            pcVar5 = ::vk::getSamplerAddressModeName(value);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&mipmapLinearTests,pcVar5,(allocator<char> *)&fullNameV);
            std::operator<<((ostream *)&fullName,"all_");
            std::__cxx11::string::substr((ulong)&fullNameW,(ulong)&mipmapLinearTests);
            de::toLower(&fullNameV,&fullNameW);
            std::operator<<((ostream *)&fullName,(string *)&fullNameV);
            std::__cxx11::string::~string((string *)&fullNameV);
            std::__cxx11::string::~string((string *)&fullNameW);
            if (value == VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_BORDER) {
              poVar8 = std::operator<<((ostream *)&fullName,"_");
              std::operator<<(poVar8,_ZZN3vkt8pipeline12_GLOBAL__N_123getAddressModesCaseNameB5cxx11EN2vk20VkSamplerAddressModeES3_S3_NS0_11BorderColorEE16borderColorNames_rel
                                     + *(int *)(
                                               _ZZN3vkt8pipeline12_GLOBAL__N_123getAddressModesCaseNameB5cxx11EN2vk20VkSamplerAddressModeES3_S3_NS0_11BorderColorEE16borderColorNames_rel
                                               + (ulong)color * 4));
            }
          }
          else {
            pcVar5 = ::vk::getSamplerAddressModeName(value);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&mipmapLinearTests,pcVar5,(allocator<char> *)&fullNameV);
            pcVar5 = ::vk::getSamplerAddressModeName(value_00);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&fullNameV,pcVar5,(allocator<char> *)&fullNameW);
            pcVar5 = ::vk::getSamplerAddressModeName(value_01);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&fullNameW,pcVar5,(allocator<char> *)&local_268);
            poVar8 = std::operator<<((ostream *)&fullName,"uvw");
            poVar8 = std::operator<<(poVar8,"_");
            std::__cxx11::string::substr((ulong)&local_1e8,(ulong)&mipmapLinearTests);
            de::toLower(&local_268,&local_1e8);
            poVar8 = std::operator<<(poVar8,(string *)&local_268);
            poVar8 = std::operator<<(poVar8,"_");
            std::__cxx11::string::substr((ulong)&local_228,(ulong)&fullNameV);
            de::toLower(&local_208,&local_228);
            poVar8 = std::operator<<(poVar8,(string *)&local_208);
            poVar8 = std::operator<<(poVar8,"_");
            std::__cxx11::string::substr((ulong)&local_248,(ulong)&fullNameW);
            de::toLower(&local_50,&local_248);
            std::operator<<(poVar8,(string *)&local_50);
            std::__cxx11::string::~string((string *)&local_50);
            std::__cxx11::string::~string((string *)&local_248);
            std::__cxx11::string::~string((string *)&local_208);
            std::__cxx11::string::~string((string *)&local_228);
            std::__cxx11::string::~string((string *)&local_268);
            std::__cxx11::string::~string((string *)&local_1e8);
            std::__cxx11::string::~string((string *)&fullNameW);
            std::__cxx11::string::~string((string *)&fullNameV);
          }
          std::__cxx11::string::~string((string *)&mipmapLinearTests);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fullName);
          pcVar5 = local_288[0];
          VVar3 = getFormatBorderColor(color,format);
          anon_unknown_0::SamplerTest::SamplerTest
                    (this,testCtx,pcVar5,"",imageViewType,format,8,0.0);
          (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
               (_func_int **)&PTR__TestCase_00bcfa18;
          *(VkSamplerAddressMode *)&this->field_0x124 = value;
          *(VkSamplerAddressMode *)
           &this[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = value_00;
          *(VkSamplerAddressMode *)
           ((long)&this[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4) =
               value_01;
          *(VkBorderColor *)&this[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = VVar3;
          tcu::TestNode::addChild(pTVar6,(TestNode *)this);
          std::__cxx11::string::~string((string *)local_288);
        }
        addressModesTests.
        super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
             (TestCaseGroup *)0x0;
        tcu::TestNode::addChild
                  (&(formatGroup.
                     super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                     m_data.ptr)->super_TestNode,&pTVar4->super_TestNode);
        de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
        ~UniqueBase(&addressModesTests.
                     super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
      }
      pTVar4 = formatGroup.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
               ptr;
      formatGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
      m_data.ptr = (TestCaseGroup *)0x0;
      tcu::TestNode::addChild
                (&(formatTests.
                   super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                   m_data.ptr)->super_TestNode,&pTVar4->super_TestNode);
      de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
      ~UniqueBase(&mipmapTests.
                   super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
      de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
      ~UniqueBase(&magFilterTests.
                   super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
      de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
      ~UniqueBase(&formatGroup.
                   super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
    }
    pTVar4 = formatTests.
             super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
             ptr;
    formatTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
    .ptr = (TestCaseGroup *)0x0;
    tcu::TestNode::addChild
              (&(viewTypeGroup.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                 m_data.ptr)->super_TestNode,&pTVar4->super_TestNode);
    pTVar4 = viewTypeGroup.
             super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
             ptr;
    viewTypeGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
    m_data.ptr = (TestCaseGroup *)0x0;
    tcu::TestNode::addChild
              (&(viewTypeTests.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                 m_data.ptr)->super_TestNode,&pTVar4->super_TestNode);
    de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
    ~UniqueBase(&formatTests.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
    de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
    ~UniqueBase(&viewTypeGroup.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
    lVar10 = lVar10 + 1;
  } while( true );
}

Assistant:

tcu::TestCaseGroup* createSamplerTests (tcu::TestContext& testCtx)
{
	const struct
	{
		VkImageViewType		type;
		const char*			name;
	}
	imageViewTypes[] =
	{
		{ VK_IMAGE_VIEW_TYPE_1D,			"1d" },
		{ VK_IMAGE_VIEW_TYPE_1D_ARRAY,		"1d_array" },
		{ VK_IMAGE_VIEW_TYPE_2D,			"2d" },
		{ VK_IMAGE_VIEW_TYPE_2D_ARRAY,		"2d_array" },
		{ VK_IMAGE_VIEW_TYPE_3D,			"3d" },
		{ VK_IMAGE_VIEW_TYPE_CUBE,			"cube" },
		{ VK_IMAGE_VIEW_TYPE_CUBE_ARRAY,	"cube_array" }
	};

	const VkFormat formats[] =
	{
		// Packed formats
		VK_FORMAT_R4G4_UNORM_PACK8,
		VK_FORMAT_R4G4B4A4_UNORM_PACK16,
		VK_FORMAT_R5G6B5_UNORM_PACK16,
		VK_FORMAT_R5G5B5A1_UNORM_PACK16,
		VK_FORMAT_A2B10G10R10_UNORM_PACK32,
		VK_FORMAT_A2R10G10B10_UINT_PACK32,
		VK_FORMAT_B10G11R11_UFLOAT_PACK32,
		VK_FORMAT_E5B9G9R9_UFLOAT_PACK32,
		VK_FORMAT_B4G4R4A4_UNORM_PACK16,
		VK_FORMAT_B5G5R5A1_UNORM_PACK16,

		// Pairwise combinations of 8-bit channel formats, UNORM/SNORM/SINT/UINT/SRGB type x 1-to-4 channels x RGBA/BGRA order
		VK_FORMAT_R8_SRGB,
		VK_FORMAT_R8G8B8_UINT,
		VK_FORMAT_B8G8R8A8_SINT,
		VK_FORMAT_R8G8_UNORM,
		VK_FORMAT_B8G8R8_SNORM,
		VK_FORMAT_R8G8B8A8_SNORM,
		VK_FORMAT_R8G8_UINT,
		VK_FORMAT_R8_SINT,
		VK_FORMAT_R8G8B8A8_SRGB,
		VK_FORMAT_R8G8B8A8_UNORM,
		VK_FORMAT_B8G8R8A8_UNORM,
		VK_FORMAT_B8G8R8_SRGB,
		VK_FORMAT_R8G8_SRGB,
		VK_FORMAT_R8_UINT,
		VK_FORMAT_R8G8B8A8_UINT,
		VK_FORMAT_R8G8_SINT,
		VK_FORMAT_R8_SNORM,
		VK_FORMAT_B8G8R8_SINT,
		VK_FORMAT_R8G8_SNORM,
		VK_FORMAT_B8G8R8_UNORM,
		VK_FORMAT_R8_UNORM,

		// Pairwise combinations of 16/32-bit channel formats x SINT/UINT/SFLOAT type x 1-to-4 channels
		VK_FORMAT_R32G32_SFLOAT,
		VK_FORMAT_R32G32B32_UINT,
		VK_FORMAT_R16G16B16A16_SFLOAT,
		VK_FORMAT_R16G16_UINT,
		VK_FORMAT_R32G32B32A32_SINT,
		VK_FORMAT_R16G16B16_SINT,
		VK_FORMAT_R16_SFLOAT,
		VK_FORMAT_R32_SINT,
		VK_FORMAT_R32_UINT,
		VK_FORMAT_R16G16B16_SFLOAT,
		VK_FORMAT_R16G16_SINT,

		// Scaled formats
		VK_FORMAT_R8G8B8A8_SSCALED,
		VK_FORMAT_A2R10G10B10_USCALED_PACK32,

		// Compressed formats
		VK_FORMAT_ETC2_R8G8B8_UNORM_BLOCK,
		VK_FORMAT_ETC2_R8G8B8_SRGB_BLOCK,
		VK_FORMAT_ETC2_R8G8B8A1_UNORM_BLOCK,
		VK_FORMAT_ETC2_R8G8B8A1_SRGB_BLOCK,
		VK_FORMAT_ETC2_R8G8B8A8_UNORM_BLOCK,
		VK_FORMAT_ETC2_R8G8B8A8_SRGB_BLOCK,
		VK_FORMAT_EAC_R11_UNORM_BLOCK,
		VK_FORMAT_EAC_R11_SNORM_BLOCK,
		VK_FORMAT_EAC_R11G11_UNORM_BLOCK,
		VK_FORMAT_EAC_R11G11_SNORM_BLOCK,
		VK_FORMAT_ASTC_4x4_UNORM_BLOCK,
		VK_FORMAT_ASTC_5x4_SRGB_BLOCK,
		VK_FORMAT_ASTC_6x5_UNORM_BLOCK,
		VK_FORMAT_ASTC_6x6_SRGB_BLOCK,
		VK_FORMAT_ASTC_8x6_UNORM_BLOCK,
		VK_FORMAT_ASTC_8x8_SRGB_BLOCK,
		VK_FORMAT_ASTC_10x6_UNORM_BLOCK,
		VK_FORMAT_ASTC_10x8_SRGB_BLOCK,
		VK_FORMAT_ASTC_12x10_UNORM_BLOCK,
		VK_FORMAT_ASTC_12x12_SRGB_BLOCK,
	};

	de::MovePtr<tcu::TestCaseGroup> samplerTests		(new tcu::TestCaseGroup(testCtx, "sampler", "Sampler tests"));
	de::MovePtr<tcu::TestCaseGroup> viewTypeTests		(new tcu::TestCaseGroup(testCtx, "view_type", ""));

	for (int viewTypeNdx = 0; viewTypeNdx < DE_LENGTH_OF_ARRAY(imageViewTypes); viewTypeNdx++)
	{
		const VkImageViewType			viewType		= imageViewTypes[viewTypeNdx].type;
		de::MovePtr<tcu::TestCaseGroup>	viewTypeGroup	(new tcu::TestCaseGroup(testCtx, imageViewTypes[viewTypeNdx].name, (std::string("Uses a ") + imageViewTypes[viewTypeNdx].name + " view").c_str()));
		de::MovePtr<tcu::TestCaseGroup>	formatTests		(new tcu::TestCaseGroup(testCtx, "format", "Tests samplable formats"));

		for (size_t formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(formats); formatNdx++)
		{
			const VkFormat	format			= formats[formatNdx];
			const bool		isCompressed	= isCompressedFormat(format);

			if (isCompressed)
			{
				// Do not use compressed formats with 1D and 1D array textures.
				if (viewType == VK_IMAGE_VIEW_TYPE_1D || viewType == VK_IMAGE_VIEW_TYPE_1D_ARRAY)
					break;
			}

			de::MovePtr<tcu::TestCaseGroup>	formatGroup	(new tcu::TestCaseGroup(testCtx,
																				getFormatCaseName(format).c_str(),
																				(std::string("Samples a texture of format ") + getFormatName(format)).c_str()));

			if (!isCompressed)
			{
				// Do not include minFilter tests with compressed formats.
				// Randomly generated compressed textures are too noisy and will derive in false positives.
				de::MovePtr<tcu::TestCaseGroup>	minFilterTests		= createSamplerMinFilterTests(testCtx, viewType, format);
				formatGroup->addChild(minFilterTests.release());
			}

			de::MovePtr<tcu::TestCaseGroup>	magFilterTests		= createSamplerMagFilterTests(testCtx, viewType, format);
			de::MovePtr<tcu::TestCaseGroup>	mipmapTests			= createSamplerMipmapTests(testCtx, viewType, format);

			formatGroup->addChild(magFilterTests.release());
			formatGroup->addChild(mipmapTests.release());

			if (viewType != VK_IMAGE_VIEW_TYPE_CUBE && viewType != VK_IMAGE_VIEW_TYPE_CUBE_ARRAY)
			{
				de::MovePtr<tcu::TestCaseGroup>	addressModesTests	= createSamplerAddressModesTests(testCtx, viewType, format);
				formatGroup->addChild(addressModesTests.release());
			}

			formatTests->addChild(formatGroup.release());
		}

		viewTypeGroup->addChild(formatTests.release());
		viewTypeTests->addChild(viewTypeGroup.release());
	}

	samplerTests->addChild(viewTypeTests.release());

	return samplerTests.release();
}